

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.h
# Opt level: O2

mat<4UL,_4UL> * mat<4UL,_4UL>::identity(void)

{
  vec<4UL,_double> *this;
  double *pdVar1;
  mat<4UL,_4UL> *in_RDI;
  long lVar2;
  size_t i;
  size_t idx;
  size_t i_00;
  bool bVar3;
  uint uVar4;
  
  in_RDI->rows[3].data[2] = 0.0;
  in_RDI->rows[3].data[3] = 0.0;
  in_RDI->rows[3].data[0] = 0.0;
  in_RDI->rows[3].data[1] = 0.0;
  in_RDI->rows[2].data[2] = 0.0;
  in_RDI->rows[2].data[3] = 0.0;
  in_RDI->rows[2].data[0] = 0.0;
  in_RDI->rows[2].data[1] = 0.0;
  in_RDI->rows[1].data[2] = 0.0;
  in_RDI->rows[1].data[3] = 0.0;
  in_RDI->rows[1].data[0] = 0.0;
  in_RDI->rows[1].data[1] = 0.0;
  in_RDI->rows[0].data[2] = 0.0;
  in_RDI->rows[0].data[3] = 0.0;
  in_RDI->rows[0].data[0] = 0.0;
  in_RDI->rows[0].data[1] = 0.0;
  idx = 4;
  lVar2 = 0;
  while (bVar3 = idx != 0, idx = idx - 1, i_00 = 3, bVar3) {
    for (; i_00 != 0xffffffffffffffff; i_00 = i_00 - 1) {
      uVar4 = 0x3ff00000;
      if (lVar2 + i_00 != 3) {
        uVar4 = 0;
      }
      this = operator[](in_RDI,idx);
      pdVar1 = vec<4UL,_double>::operator[](this,i_00);
      *pdVar1 = (double)((ulong)uVar4 << 0x20);
    }
    lVar2 = lVar2 + 1;
  }
  return in_RDI;
}

Assistant:

static mat<nrows, ncols> identity()
    {
        mat<nrows, ncols> ret;
        for (size_t i = nrows; i--;)
            for (size_t j = ncols; j--; ret[i][j] = (i == j))
                ;
        return ret;
    }